

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O0

SPIRVariable * __thiscall
spirv_cross::Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass&>
          (Compiler *this,uint32_t id,uint *args,StorageClass *args_1)

{
  Variant *var_00;
  TypedID<(spirv_cross::Types)0> local_3c;
  SPIRVariable *local_38;
  SPIRVariable *var;
  StorageClass *local_28;
  StorageClass *args_local_1;
  uint *args_local;
  Compiler *pCStack_10;
  uint32_t id_local;
  Compiler *this_local;
  
  local_28 = args_1;
  args_local_1 = args;
  args_local._4_4_ = id;
  pCStack_10 = this;
  TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)((long)&var + 4),id);
  ParsedIR::add_typed_id(&this->ir,TypeVariable,var._4_4_);
  var_00 = VectorView<spirv_cross::Variant>::operator[]
                     (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)args_local._4_4_
                     );
  local_38 = variant_set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass&>
                       (var_00,args_local_1,local_28);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_3c,args_local._4_4_);
  (local_38->super_IVariant).self.id = local_3c.id;
  set_initializers<spirv_cross::SPIRVariable>(this,local_38);
  return local_38;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}